

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_char<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,char value,
          basic_format_specs<char> *specs)

{
  long lVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong n;
  
  lVar1 = (long)specs->width;
  if (-1 < lVar1) {
    uVar5 = 0;
    if (lVar1 != 0) {
      uVar5 = lVar1 - 1;
    }
    n = uVar5 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                           (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>(out,n,&specs->fill);
    sVar3 = (bVar2.container)->size_;
    uVar4 = sVar3 + 1;
    if ((bVar2.container)->capacity_ < uVar4) {
      (**(bVar2.container)->_vptr_buffer)(bVar2.container);
      sVar3 = (bVar2.container)->size_;
      uVar4 = sVar3 + 1;
    }
    (bVar2.container)->size_ = uVar4;
    (bVar2.container)->ptr_[sVar3] = value;
    bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (bVar2,uVar5 - n,&specs->fill);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

inline OutputIt write_padded(OutputIt out,
                             const basic_format_specs<Char>& specs, size_t size,
                             size_t width, F&& f) {
  static_assert(align == align::left || align == align::right, "");
  unsigned spec_width = to_unsigned(specs.width);
  size_t padding = spec_width > width ? spec_width - width : 0;
  auto* shifts = align == align::left ? data::left_padding_shifts
                                      : data::right_padding_shifts;
  size_t left_padding = padding >> shifts[specs.align];
  auto it = reserve(out, size + padding * specs.fill.size());
  it = fill(it, left_padding, specs.fill);
  it = f(it);
  it = fill(it, padding - left_padding, specs.fill);
  return base_iterator(out, it);
}